

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O0

void M3x3_ExtractEulerAngles_XYZ(double (*matrix) [3],double *angles)

{
  double *in_RSI;
  double *in_RDI;
  double __x;
  double dVar1;
  double cosY;
  double az;
  double ay;
  double ax;
  double local_28;
  double local_18;
  
  if ((*in_RDI != 9999999.0) || (NAN(*in_RDI))) {
    __x = sqrt(*in_RDI * *in_RDI + in_RDI[1] * in_RDI[1]);
    dVar1 = atan2(in_RDI[2],__x);
    if (0.0001 <= __x) {
      local_28 = atan2(-in_RDI[1],*in_RDI);
      local_18 = atan2(-in_RDI[5],in_RDI[8]);
    }
    else {
      if (dVar1 <= 0.0) {
        local_18 = atan2(-in_RDI[3],in_RDI[4]);
      }
      else {
        local_18 = atan2(in_RDI[3],in_RDI[4]);
      }
      local_28 = 0.0;
    }
    *in_RSI = local_18 * 57.29577951308232;
    in_RSI[1] = dVar1 * 57.29577951308232;
    in_RSI[2] = local_28 * 57.29577951308232;
  }
  else {
    *in_RSI = 9999999.0;
    in_RSI[1] = 9999999.0;
    in_RSI[2] = 9999999.0;
  }
  return;
}

Assistant:

void M3x3_ExtractEulerAngles_XYZ(
  double matrix[3][3],
  double angles[3])
{
    double ax,ay,az;
    double cosY;

/*
   R[XYZ] = Rx * Ry * Rz

            | 1   0    0 |   |  cy   0   sy |   | cz   -sz   0 |
          = | 0   cx  -sx| * |   0   1    0 | * | sz    cz   0 |
            | 0   sx   cx|   | -sy   0   cy |   |  0    0    1 |


            | cycz            -cysz             sy   |
          = | cxsz + sxsycz    cxcz - sxsysz   -sxcy |
            | sxsz - cxsycz    sxcz + cxsysz    cxcy |
*/

    if (matrix[0][0] == XEMPTY)
    {
        angles[0] = XEMPTY;
        angles[1] = XEMPTY;
        angles[2] = XEMPTY;
        return;
    }

    cosY = sqrt(matrix[0][0]*matrix[0][0] + matrix[0][1]*matrix[0][1]);
    ay = atan2(matrix[0][2], cosY);

    if (cosY < 0.0001) // cos(ay) < 0.01
    {
     // Assume sy=+-1,cy=0,sz=0,cz=1.0 and decode the matrix accordingly

        if (ay > 0)
            ax = atan2( matrix[1][0], matrix[1][1]);
        else
            ax = atan2(-matrix[1][0], matrix[1][1]);

        az = 0.0;
    }
    else
    {
        az = atan2(-matrix[0][1], matrix[0][0]);
        ax = atan2(-matrix[1][2], matrix[2][2]);
    }

    angles[0] = ax * (180.0/M_PI);
    angles[1] = ay * (180.0/M_PI);
    angles[2] = az * (180.0/M_PI);
}